

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O1

void __thiscall
sim_combinational_order_correct_Test::TestBody(sim_combinational_order_correct_Test *this)

{
  size_type *psVar1;
  uint64_t this_00;
  int iVar2;
  Generator *this_01;
  Var *pVVar3;
  Var *pVVar4;
  Var *var;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_long> __l_01;
  optional<unsigned_long> oVar5;
  undefined1 local_370 [8];
  Context context;
  Simulator sim;
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  uint32_t value;
  _Storage<unsigned_long,_true> _Stack_88;
  optional<unsigned_long> res;
  Message local_68;
  AssertionResult gtest_ar_;
  undefined1 auStack_50 [8];
  AssertionResult gtest_ar;
  
  local_370 = (undefined1  [8])&context.modules_._M_h._M_rehash_policy._M_next_resize;
  context.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.modules_._M_h._M_bucket_count = 0;
  context.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.modules_._M_h._M_rehash_policy._4_4_ = 0;
  context.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  context.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&context.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  context.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.generator_hash_._M_h._M_bucket_count = 0;
  context.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&context.enum_defs_;
  context.enum_defs_._M_t._M_impl._0_4_ = 0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  context.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  context.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  context.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&context.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  context.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.empty_generators_._M_h._M_bucket_count = 0;
  context.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  context._224_8_ = &context.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  context.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  context.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  context.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  context.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  context.tracked_generators_._M_h._M_bucket_count = 0;
  context.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  context.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  context.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  context.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  psVar1 = &sim.values_._M_h._M_bucket_count;
  context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"mod","");
  this_01 = kratos::Context::generator
                      ((Context *)local_370,
                       (string *)&context.tracked_generators_._M_h._M_single_bucket);
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)psVar1) {
    operator_delete(context.tracked_generators_._M_h._M_single_bucket,
                    sim.values_._M_h._M_bucket_count + 1);
  }
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"a","");
  _Stack_88._M_value = 0x200000002;
  __l._M_len = 2;
  __l._M_array = (iterator)&_Stack_88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_50,__l,
             (allocator_type *)&sim.simulation_depth_);
  pVVar3 = kratos::Generator::var
                     (this_01,(string *)&context.tracked_generators_._M_h._M_single_bucket,4,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_50);
  if (auStack_50 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_50,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl - (long)auStack_50);
  }
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)psVar1) {
    operator_delete(context.tracked_generators_._M_h._M_single_bucket,
                    sim.values_._M_h._M_bucket_count + 1);
  }
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"b","");
  _Stack_88._M_value = 0x200000002;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&_Stack_88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_50,__l_00,
             (allocator_type *)&sim.simulation_depth_);
  pVVar4 = kratos::Generator::var
                     (this_01,(string *)&context.tracked_generators_._M_h._M_single_bucket,4,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_50);
  if (auStack_50 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_50,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl - (long)auStack_50);
  }
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)psVar1) {
    operator_delete(context.tracked_generators_._M_h._M_single_bucket,
                    sim.values_._M_h._M_bucket_count + 1);
  }
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&context.tracked_generators_._M_h._M_single_bucket,"c","");
  var = kratos::Generator::var
                  (this_01,(string *)&context.tracked_generators_._M_h._M_single_bucket,4);
  if (context.tracked_generators_._M_h._M_single_bucket != (__node_base_ptr)psVar1) {
    operator_delete(context.tracked_generators_._M_h._M_single_bucket,
                    sim.values_._M_h._M_bucket_count + 1);
  }
  kratos::Generator::combinational((Generator *)&sim.simulation_depth_);
  this_00 = sim.simulation_depth_;
  kratos::Var::assign((Var *)auStack_50,pVVar3);
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)auStack_50;
  sim.values_._M_h._M_buckets = (__buckets_ptr)gtest_ar._0_8_;
  auStack_50 = (undefined1  [8])0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)this_00,
             (shared_ptr<kratos::Stmt> *)&context.tracked_generators_._M_h._M_single_bucket);
  if (sim.values_._M_h._M_buckets != (__buckets_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sim.values_._M_h._M_buckets);
  }
  if (gtest_ar._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_ar._0_8_);
  }
  iVar2 = (*(pVVar3->super_IRNode)._vptr_IRNode[9])(pVVar3,1);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))
            ((long *)CONCAT44(extraout_var,iVar2),1);
  kratos::Var::assign((Var *)auStack_50,var);
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)auStack_50;
  sim.values_._M_h._M_buckets = (__buckets_ptr)gtest_ar._0_8_;
  auStack_50 = (undefined1  [8])0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)sim.simulation_depth_,
             (shared_ptr<kratos::Stmt> *)&context.tracked_generators_._M_h._M_single_bucket);
  if (sim.values_._M_h._M_buckets != (__buckets_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sim.values_._M_h._M_buckets);
  }
  if (gtest_ar._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_ar._0_8_);
  }
  kratos::Simulator::Simulator
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,this_01);
  comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 5;
  iVar2 = (*(pVVar4->super_IRNode)._vptr_IRNode[9])(pVVar4,1);
  pVVar3 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x48))
                            ((long *)CONCAT44(extraout_var_00,iVar2),1);
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x5;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_68;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_88,__l_01,
             (allocator_type *)&gtest_ar_.message_);
  auStack_50 = (undefined1  [8])_Stack_88;
  gtest_ar._0_8_ =
       res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._8_8_;
  _Stack_88._M_value = 0;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 0;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = false;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = 0;
  kratos::Simulator::set
            ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,pVVar3,
             (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)auStack_50,
             true);
  if (auStack_50 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_50,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl - (long)auStack_50);
  }
  if ((void *)_Stack_88._M_value != (void *)0x0) {
    operator_delete((void *)_Stack_88,
                    res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._8_8_ - (long)_Stack_88);
  }
  oVar5 = kratos::Simulator::get
                    ((Simulator *)&context.tracked_generators_._M_h._M_single_bucket,var);
  _Stack_88._M_value =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_68.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(CONCAT71(local_68.ss_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._1_7_,
                   oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_engaged) & 0xffffffffffffff01);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (((undefined1  [16])
       oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_50,(internal *)&local_68,(AssertionResult *)"res != std::nullopt",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x71,(char *)auStack_50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    if (auStack_50 != (undefined1  [8])&gtest_ar.message_) {
      operator_delete((void *)auStack_50,
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)auStack_50,"*res","value",&_Stack_88._M_value,
             (uint *)((long)&comb.
                             super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 4));
  if (auStack_50[0] == '\0') {
    testing::Message::Message(&local_68);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x72,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_68.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_68.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  std::
  _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sim.scope_._M_h._M_single_bucket);
  std::
  _Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&sim.linked_dependency_._M_h._M_single_bucket);
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sim.dependency_._M_h._M_single_bucket);
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_set<kratos::Stmt_*,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sim.event_queue_.c.
                    super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  _Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
  ::~_Deque_base((_Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
                  *)&sim.complex_values_._M_h._M_single_bucket);
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&sim.values_._M_h._M_single_bucket);
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&context.tracked_generators_._M_h._M_single_bucket);
  if (comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&context.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&context.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&context.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&context.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_370);
  return;
}

Assistant:

TEST(sim, combinational_order_correct) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 4, {2, 2});
    auto &b = mod.var("b", 4, {2, 2});
    auto &c = mod.var("c", 4);
    auto comb = mod.combinational();
    comb->add_stmt(a.assign(b));
    comb->add_stmt(c.assign(a[1][1]));

    Simulator sim(&mod);
    uint32_t constexpr value = 5;
    sim.set(&(b[1][1]), std::vector<uint64_t>{value});

    auto res = sim.get(&c);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, value);
}